

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.hpp
# Opt level: O2

string_t duckdb::regexp_util::Extract(string_t *input,Vector *result,RE2 *re,StringPiece *rewrite)

{
  undefined1 *len;
  anon_union_16_2_67f50693_for_value aVar1;
  string extracted;
  undefined1 local_68 [32];
  string local_48;
  StringPiece local_28;
  
  len = local_68;
  local_68._0_8_ = local_68 + 0x10;
  local_68._8_8_ = (char *)0x0;
  local_68[0x10] = '\0';
  string_t::GetString_abi_cxx11_(&local_48,input);
  local_28.data_ = local_48._M_dataplus._M_p;
  local_28.size_ = local_48._M_string_length;
  duckdb_re2::RE2::Extract(&local_28,re,rewrite,(string *)local_68);
  ::std::__cxx11::string::~string((string *)&local_48);
  aVar1.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringVector::AddString
                 ((StringVector *)result,(Vector *)local_68._0_8_,(char *)local_68._8_8_,(idx_t)len)
  ;
  ::std::__cxx11::string::~string((string *)local_68);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar1.pointer;
}

Assistant:

inline string_t Extract(const string_t &input, Vector &result, const RE2 &re, const duckdb_re2::StringPiece &rewrite) {
	string extracted;
	RE2::Extract(input.GetString(), re, rewrite, &extracted);
	return StringVector::AddString(result, extracted.c_str(), extracted.size());
}